

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error __thiscall i2i::format<10,13>(i2i *this,context *ctx,token *token,opcode *op)

{
  _Storage<unsigned_long,_true> _Var1;
  string_view prefix;
  string_view prefix_00;
  optional<unsigned_long> oVar2;
  token local_50;
  
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar2 = find_in_table(token,format<10,_13>::table_unsigned,prefix);
  _Var1._M_value =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (((undefined1  [16])
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    prefix_00._M_str = ".";
    prefix_00._M_len = 1;
    oVar2 = find_in_table(token,format<10,_13>::table_signed,prefix_00);
    _Var1._M_value =
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    if (((undefined1  [16])
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      fail((token *)this,(char *)token,"expected .U8, .U16, .U32, .S8, .S16 or .S32");
      return (unique_ptr<char[],_std::default_delete<char[]>_>)
             (unique_ptr<char[],_std::default_delete<char[]>_>)this;
    }
    opcode::add_bits(op,0x2000);
  }
  opcode::add_bits(op,_Var1._M_value << 10);
  context::tokenize(&local_50,ctx);
  token->column = local_50.column;
  (token->data).string._M_str = local_50.data.string._M_str;
  token->type = local_50.type;
  token->line = local_50.line;
  token->filename = local_50.filename;
  (token->data).predicate = local_50.data.predicate;
  *(undefined8 *)this = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(format)
    {
        static const char* table_unsigned[] = {"U8", "U16", "U32", nullptr};
        static const char* table_signed[] = {"S8", "S16", "S32", nullptr};

        std::optional<int64_t> result = find_in_table(token, table_unsigned, ".");
        if (!result) {
            result = find_in_table(token, table_signed, ".");
            if (!result) {
                return fail(token, "expected .U8, .U16, .U32, .S8, .S16 or .S32");
            }
            op.add_bits(1ULL << sign_address);
        }
        op.add_bits(*result << address);
        token = ctx.tokenize();
        return {};
    }